

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2coords.h
# Opt level: O2

S2Point * S2::FaceUVtoXYZ(S2Point *__return_storage_ptr__,int face,double u,double v)

{
  VType VVar1;
  double dVar2;
  
  VVar1 = v;
  dVar2 = v;
  switch(face) {
  case 0:
    dVar2 = 1.0;
    break;
  case 1:
    dVar2 = -u;
    u = 1.0;
    break;
  case 2:
    dVar2 = -u;
    u = -v;
    VVar1 = 1.0;
    break;
  case 3:
    dVar2 = -1.0;
    VVar1 = -u;
    u = -v;
    break;
  case 4:
    VVar1 = -u;
    u = -1.0;
    break;
  default:
    VVar1 = -1.0;
  }
  __return_storage_ptr__->c_[0] = dVar2;
  __return_storage_ptr__->c_[1] = u;
  __return_storage_ptr__->c_[2] = VVar1;
  return __return_storage_ptr__;
}

Assistant:

inline S2Point FaceUVtoXYZ(int face, double u, double v) {
  switch (face) {
    case 0:  return S2Point( 1,  u,  v);
    case 1:  return S2Point(-u,  1,  v);
    case 2:  return S2Point(-u, -v,  1);
    case 3:  return S2Point(-1, -v, -u);
    case 4:  return S2Point( v, -1, -u);
    default: return S2Point( v,  u, -1);
  }
}